

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O1

int32_t anon_unknown.dwarf_317cee::getStringArray
                  (ResourceData *pResData,ResourceArray *array,UnicodeString *dest,int32_t capacity,
                  UErrorCode *errorCode)

{
  UErrorCode UVar1;
  uint uVar2;
  ulong uVar3;
  Resource res;
  ulong uVar4;
  int32_t sLength;
  ConstChar16Ptr local_58;
  int32_t local_4c;
  ulong local_48;
  UChar *local_40;
  
  uVar3 = 0;
  if (U_ZERO_ERROR < *errorCode) goto LAB_002d2ce9;
  if (dest == (UnicodeString *)0x0) {
    if (capacity != 0) goto LAB_002d2cde;
LAB_002d2c25:
    uVar2 = array->length;
    local_48 = (ulong)uVar2;
    if (local_48 == 0) goto LAB_002d2ce9;
    UVar1 = U_BUFFER_OVERFLOW_ERROR;
    uVar3 = local_48;
    if ((int)uVar2 <= capacity) {
      if (0 < (int)uVar2) {
        uVar4 = 0;
        do {
          if (array->items16 == (uint16_t *)0x0) {
            res = array->items32[uVar4];
          }
          else {
            uVar2 = (uint)array->items16[uVar4];
            if (pResData->poolStringIndex16Limit <= (int)uVar2) {
              uVar2 = (uVar2 - pResData->poolStringIndex16Limit) + pResData->poolStringIndexLimit;
            }
            res = uVar2 | 0x60000000;
          }
          local_58.p_ = res_getString_63(pResData,res,&local_4c);
          if (local_58.p_ == (UChar *)0x0) {
            *errorCode = U_RESOURCE_TYPE_MISMATCH;
            uVar3 = 0;
            break;
          }
          icu_63::UnicodeString::setTo(dest,'\x01',&local_58,local_4c);
          local_40 = local_58.p_;
          uVar4 = uVar4 + 1;
          dest = dest + 1;
          uVar3 = local_48;
        } while (local_48 != uVar4);
      }
      goto LAB_002d2ce9;
    }
  }
  else {
    if (-1 < capacity) goto LAB_002d2c25;
LAB_002d2cde:
    uVar3 = 0;
    UVar1 = U_ILLEGAL_ARGUMENT_ERROR;
  }
  *errorCode = UVar1;
LAB_002d2ce9:
  return (int32_t)uVar3;
}

Assistant:

int32_t getStringArray(const ResourceData *pResData, const icu::ResourceArray &array,
                       icu::UnicodeString *dest, int32_t capacity,
                       UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if(dest == NULL ? capacity != 0 : capacity < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t length = array.getSize();
    if(length == 0) {
        return 0;
    }
    if(length > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return length;
    }
    for(int32_t i = 0; i < length; ++i) {
        int32_t sLength;
        const UChar *s = res_getString(pResData, array.internalGetResource(pResData, i), &sLength);
        if(s == NULL) {
            errorCode = U_RESOURCE_TYPE_MISMATCH;
            return 0;
        }
        dest[i].setTo(TRUE, s, sLength);
    }
    return length;
}